

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

string * cppNameOf_abi_cxx11_(string *__return_storage_ptr__,NodePtr *n)

{
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  NodePtr local_20;
  
  switch(n->px->type_) {
  case AVRO_STRING:
    __s = "string";
    break;
  case AVRO_BYTES:
    __s = "bytes";
    break;
  case AVRO_INT:
    __s = "int";
    break;
  case AVRO_LONG:
    __s = "long";
    break;
  case AVRO_FLOAT:
    __s = "float";
    break;
  case AVRO_DOUBLE:
    __s = "double";
    break;
  case AVRO_BOOL:
    __s = "bool";
    break;
  case AVRO_NULL:
    __s = "null";
    break;
  case AVRO_RECORD:
  case AVRO_ENUM:
  case AVRO_FIXED:
    iVar1 = (*n->px->_vptr_Node[3])();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(CONCAT44(extraout_var,iVar1) + 0x20));
    return __return_storage_ptr__;
  case AVRO_ARRAY:
    __s = "array";
    break;
  case AVRO_MAP:
    __s = "map";
    break;
  default:
    __s = "$Undefined$";
    break;
  case AVRO_NUM_TYPES:
    avro::resolveSymbol((avro *)&local_20,n);
    cppNameOf_abi_cxx11_(__return_storage_ptr__,&local_20);
    boost::detail::shared_count::~shared_count(&local_20.pn);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

static string cppNameOf(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_NULL:
        return "null";
    case avro::AVRO_STRING:
        return "string";
    case avro::AVRO_BYTES:
        return "bytes";
    case avro::AVRO_INT:
        return "int";
    case avro::AVRO_LONG:
        return "long";
    case avro::AVRO_FLOAT:
        return "float";
    case avro::AVRO_DOUBLE:
        return "double";
    case avro::AVRO_BOOL:
        return "bool";
    case avro::AVRO_RECORD:
    case avro::AVRO_ENUM:
    case avro::AVRO_FIXED:
        return decorate(n->name());
    case avro::AVRO_ARRAY:
        return "array";
    case avro::AVRO_MAP:
        return "map";
    case avro::AVRO_SYMBOLIC:
        return cppNameOf(resolveSymbol(n));
    default:
        return "$Undefined$";
    }
}